

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void PPRF_compute_all_keys(vector<GGMNode,_std::allocator<GGMNode>_> *node_list,int level)

{
  double dVar1;
  double dVar2;
  iterator iVar3;
  mapped_type puVar4;
  mapped_type *ppuVar5;
  int __exponent;
  long offset;
  long lVar6;
  int iVar7;
  uint8_t derive_key [16];
  long local_78;
  int local_6c;
  pointer local_68;
  pointer local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_60 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_68 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_60 != local_68) {
    local_6c = level;
    do {
      lVar6 = local_60->index;
      local_48 = *(undefined8 *)local_60->key;
      uStack_40 = *(undefined8 *)(local_60->key + 8);
      __exponent = local_6c - local_60->level;
      dVar1 = ldexp(1.0,__exponent);
      if (0.0 < dVar1) {
        lVar6 = (lVar6 << ((byte)__exponent & 0x3f)) << 0x20;
        iVar7 = 1;
        do {
          local_58 = local_48;
          uStack_50 = uStack_40;
          offset = lVar6 >> 0x20;
          GGMTree::derive_key_from_tree((uint8_t *)&local_58,offset,__exponent,0);
          local_78 = offset;
          iVar3 = std::
                  _Hashtable<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&keys._M_h,&local_78);
          if (iVar3.super__Node_iterator_base<std::pair<const_long,_unsigned_char_*>,_false>._M_cur
              == (__node_type *)0x0) {
            puVar4 = (mapped_type)malloc(0x10);
            local_78 = offset;
            ppuVar5 = std::__detail::
                      _Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&keys,&local_78);
            *ppuVar5 = puVar4;
            local_78 = offset;
            ppuVar5 = std::__detail::
                      _Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&keys,&local_78);
            puVar4 = *ppuVar5;
            *(undefined8 *)puVar4 = local_58;
            *(undefined8 *)(puVar4 + 8) = uStack_50;
          }
          dVar1 = (double)iVar7;
          dVar2 = ldexp(1.0,__exponent);
          lVar6 = lVar6 + 0x100000000;
          iVar7 = iVar7 + 1;
        } while (dVar1 < dVar2);
      }
      local_60 = local_60 + 1;
    } while (local_60 != local_68);
  }
  return;
}

Assistant:

void PPRF_compute_all_keys(const vector<GGMNode>& node_list, int level) {
    for(GGMNode node : node_list) {
        for (int i = 0; i < pow(2, level - node.level); ++i) {
            int offset = ((node.index) << (level - node.level)) + i;
            uint8_t derive_key[AES_BLOCK_SIZE];
            memcpy(derive_key, node.key, AES_BLOCK_SIZE);
            GGMTree::derive_key_from_tree(derive_key,  offset, level - node.level, 0);
            if(keys.find(offset) == keys.end()) {
                keys[offset] = (uint8_t*) malloc(AES_BLOCK_SIZE);
                memcpy(keys[offset], derive_key, AES_BLOCK_SIZE);
//                for (int j = 0 ; j <16; ++j){
//                    printf ( "%02x ",keys[offset][j]);
//                }
//                cout << endl;
            }
        }
    }
}